

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

int dmgval(monst *magr,obj *otmp,boolean thrown,monst *mdef)

{
  permonst *ptr_00;
  bool bVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  uint local_74;
  int local_64;
  int bonus;
  int old_tmp;
  boolean odd_adjusted_multi;
  int multi_heavy;
  int wt;
  obj *olaunch;
  boolean double_damage;
  boolean Is_weapon;
  permonst *ptr;
  int otyp;
  int tmp;
  monst *mdef_local;
  boolean thrown_local;
  obj *otmp_local;
  monst *magr_local;
  
  ptr._4_4_ = 0;
  iVar3 = (int)otmp->otyp;
  ptr_00 = mdef->data;
  bVar5 = true;
  if ((otmp->oclass != '\x02') && (bVar5 = false, otmp->oclass == '\x06')) {
    bVar5 = objects[otmp->otyp].oc_subtyp != '\0';
  }
  if (iVar3 == 0x120) {
    return 0;
  }
  if (magr == &youmonst) {
    _multi_heavy = uwep;
  }
  else if (magr == (monst *)0x0) {
    _multi_heavy = (obj *)0x0;
  }
  else {
    _multi_heavy = magr->mw;
  }
  if ((_multi_heavy != (obj *)0x0) &&
     ((((((_multi_heavy->oclass != '\x02' || (objects[_multi_heavy->otyp].oc_subtyp < '\x16')) ||
         ('\x18' < objects[_multi_heavy->otyp].oc_subtyp)) ||
        ((otmp->oclass != '\x02' && (otmp->oclass != '\r')))) ||
       ((objects[otmp->otyp].oc_subtyp < -0x18 ||
        ((-0x16 < objects[otmp->otyp].oc_subtyp || (_multi_heavy == (obj *)0x0)))))) ||
      ((int)objects[otmp->otyp].oc_subtyp != -(int)objects[_multi_heavy->otyp].oc_subtyp)))) {
    _multi_heavy = (obj *)0x0;
  }
  if (2 < ptr_00->msize) {
    if (objects[iVar3].oc_wldam != '\0') {
      ptr._4_4_ = rnd((int)objects[iVar3].oc_wldam);
    }
    if (iVar3 != 6) {
      if ((iVar3 == 0x10) || (iVar3 == 0x1c)) {
LAB_00335140:
        iVar4 = dice(2,4);
        ptr._4_4_ = iVar4 + ptr._4_4_;
        goto LAB_00335292;
      }
      if (1 < iVar3 - 0x24U) {
        if ((iVar3 == 0x27) || (iVar3 == 0x29)) {
LAB_00335157:
          iVar4 = dice(2,6);
          ptr._4_4_ = iVar4 + ptr._4_4_;
          goto LAB_00335292;
        }
        if (1 < iVar3 - 0x2aU) {
          if (iVar3 != 0x2c) {
            if ((iVar3 == 0x2d) || (iVar3 == 0x30)) {
LAB_0033512e:
              iVar4 = rnd(6);
              ptr._4_4_ = iVar4 + ptr._4_4_;
              goto LAB_00335292;
            }
            if (iVar3 == 0x31) goto LAB_00335140;
            if (iVar3 != 0x32) {
              if (iVar3 == 0x33) goto LAB_00335157;
              if (iVar3 != 0x3a) {
                if (iVar3 == 0x40) goto LAB_0033511c;
                if (iVar3 != 0x217) {
                  if (iVar3 != 0x219) goto LAB_00335292;
                  goto LAB_0033512e;
                }
              }
              goto LAB_00335111;
            }
          }
LAB_0033511c:
          iVar4 = rnd(4);
          ptr._4_4_ = iVar4 + ptr._4_4_;
          goto LAB_00335292;
        }
      }
    }
LAB_00335111:
    ptr._4_4_ = ptr._4_4_ + 1;
    goto LAB_00335292;
  }
  if (objects[iVar3].oc_wsdam != '\0') {
    ptr._4_4_ = rnd((int)objects[iVar3].oc_wsdam);
  }
  if ((iVar3 != 6) && (iVar3 != 0x10)) {
    if ((iVar3 == 0x1c) || (((iVar3 - 0x24U < 2 || (iVar3 == 0x2a)) || (iVar3 == 0x2c)))) {
LAB_0033526e:
      iVar4 = rnd(4);
      ptr._4_4_ = iVar4 + ptr._4_4_;
      goto LAB_00335292;
    }
    if (iVar3 != 0x2d) {
      if ((iVar3 - 0x31U < 2) || (iVar3 - 0x35U < 3)) goto LAB_0033526e;
      if (iVar3 != 0x39) {
        if (iVar3 == 0x3a) goto LAB_0033526e;
        if (((iVar3 != 0x3b) && (iVar3 != 0x40)) && (iVar3 != 0x217)) {
          if (iVar3 == 0x219) {
            iVar4 = rnd(6);
            ptr._4_4_ = iVar4 + ptr._4_4_;
          }
          goto LAB_00335292;
        }
      }
    }
  }
  ptr._4_4_ = ptr._4_4_ + 1;
LAB_00335292:
  if (bVar5) {
    ptr._4_4_ = otmp->spe + ptr._4_4_;
  }
  if ((((thrown != '\0') && (_multi_heavy != (obj *)0x0)) &&
      ((otmp->oclass == '\x02' || (otmp->oclass == '\r')))) &&
     ((((-0x19 < objects[otmp->otyp].oc_subtyp && (objects[otmp->otyp].oc_subtyp < -0x15)) &&
       (_multi_heavy != (obj *)0x0)) &&
      (((int)objects[otmp->otyp].oc_subtyp == -(int)objects[_multi_heavy->otyp].oc_subtyp &&
       (objects[_multi_heavy->otyp].oc_subtyp == '\x17')))))) {
    ptr._4_4_ = _multi_heavy->spe + ptr._4_4_;
  }
  if (ptr._4_4_ < 0) {
    ptr._4_4_ = 0;
  }
  if (((*(ushort *)&objects[iVar3].field_0x11 >> 4 & 0x1f) < 8) &&
     ((ptr_00->mflags1 & 0x200000) != 0)) {
    ptr._4_4_ = 0;
  }
  if ((ptr_00 == mons + 299) && ((*(ushort *)&objects[iVar3].field_0x11 >> 4 & 0x1f) != 0xe)) {
    ptr._4_4_ = 0;
  }
  if (((iVar3 == 0x216) && (0 < ptr._4_4_)) &&
     ((int)(uint)objects[0x216].oc_weight < (int)otmp->owt)) {
    iVar4 = rnd((int)(otmp->owt - (uint)objects[0x216].oc_weight) / 0xa0 << 2);
    ptr._4_4_ = iVar4 + ptr._4_4_;
    if (0x19 < ptr._4_4_) {
      ptr._4_4_ = 0x19;
    }
  }
  iVar4 = spec_dbon(otmp,_multi_heavy,thrown,mdef,0x19);
  bVar1 = 0x18 < iVar4;
  iVar4 = ptr._4_4_;
  if (((thrown != '\0') && (otmp->oclass == '\x02')) &&
     (((((otmp->oclass != '\x02' && (otmp->oclass != '\r')) ||
        ((objects[otmp->otyp].oc_subtyp < -0x18 || (-0x16 < objects[otmp->otyp].oc_subtyp)))) ||
       (((otmp->oclass == '\x02' || (otmp->oclass == '\r')) &&
        ((((-0x19 < objects[otmp->otyp].oc_subtyp && (objects[otmp->otyp].oc_subtyp < -0x15)) &&
          (_multi_heavy != (obj *)0x0)) &&
         ((int)objects[otmp->otyp].oc_subtyp == -(int)objects[_multi_heavy->otyp].oc_subtyp)))))) &&
      ((((otmp->oclass == '\x02' && ('\x11' < objects[otmp->otyp].oc_subtyp)) &&
        (objects[otmp->otyp].oc_subtyp < '\x14')) ||
       (((objects[otmp->otyp].oc_subtyp == -0x18 || (objects[otmp->otyp].oc_subtyp == -0x1a)) ||
        (objects[otmp->otyp].oc_subtyp == -0x1b)))))))) {
    iVar4 = multishot_max(magr,otmp);
    old_tmp = rnd(iVar4);
    bVar6 = false;
    if ((1 < old_tmp) && (bVar1)) {
      bVar6 = (old_tmp + 1U & 1) != 0;
      old_tmp = (old_tmp + 1) / 2;
    }
    iVar4 = old_tmp * ptr._4_4_;
    if ((bVar6) && (bVar1)) {
      iVar4 = (ptr._4_4_ + 1) / 2 + iVar4;
    }
  }
  ptr._4_4_ = iVar4;
  if ((((bVar5) || (otmp->oclass == '\r')) || (otmp->oclass == '\x0f')) || (otmp->oclass == '\x10'))
  {
    local_64 = 0;
    if (((*(uint *)&otmp->field_0x4a >> 1 & 1) != 0) &&
       (((ptr_00->mflags2 & 2) != 0 || ((ptr_00->mflags2 & 0x200) != 0)))) {
      local_64 = rnd(4);
    }
    if (((otmp->oclass == '\x02') || (otmp->oclass == '\x06')) &&
       ((objects[otmp->otyp].oc_subtyp == '\x03' && (ptr_00 == mons + 0x105)))) {
      iVar4 = rnd(4);
      local_64 = iVar4 + local_64;
    }
    if (((*(ushort *)&objects[iVar3].field_0x11 >> 4 & 0x1f) == 0xe) &&
       (bVar2 = hates_silver(ptr_00), bVar2 != '\0')) {
      iVar3 = rnd(0x14);
      local_64 = iVar3 + local_64;
    }
    if ((1 < local_64) && (bVar1)) {
      local_64 = (local_64 + 1) / 2;
    }
    ptr._4_4_ = local_64 + ptr._4_4_;
  }
  if (0 < ptr._4_4_) {
    if ((*(uint *)&otmp->field_0x4a >> 10 & 3) < (*(uint *)&otmp->field_0x4a >> 8 & 3)) {
      local_74 = *(uint *)&otmp->field_0x4a >> 8;
    }
    else {
      local_74 = *(uint *)&otmp->field_0x4a >> 10;
    }
    local_74 = local_74 & 3;
    ptr._4_4_ = ptr._4_4_ - local_74;
    if (ptr._4_4_ < 1) {
      ptr._4_4_ = 1;
    }
  }
  return ptr._4_4_;
}

Assistant:

int dmgval(struct monst *magr, struct obj *otmp, boolean thrown,
	   struct monst *mdef)
{
	int tmp = 0, otyp = otmp->otyp;
	const struct permonst *ptr = mdef->data;
	boolean Is_weapon = (otmp->oclass == WEAPON_CLASS || is_weptool(otmp));
	boolean double_damage;
	struct obj *olaunch;

	if (otyp == CREAM_PIE) return 0;

	if (magr == &youmonst)
	    olaunch = uwep;
	else if (magr)
	    olaunch = MON_WEP(magr);
	else
	    olaunch = NULL;
	if (olaunch && (!is_launcher(olaunch) ||
			!ammo_and_launcher(otmp, olaunch)))
	    olaunch = NULL;

	if (bigmonst(ptr)) {
	    if (objects[otyp].oc_wldam)
		tmp = rnd(objects[otyp].oc_wldam);
	    switch (otyp) {
		case IRON_CHAIN:
		case CROSSBOW_BOLT:
		case MORNING_STAR:
		case PARTISAN:
		case RUNESWORD:
		case ELVEN_BROADSWORD:
		case BROADSWORD:	tmp++; break;

		case FLAIL:
		case RANSEUR:
		case VOULGE:		tmp += rnd(4); break;

		case ACID_VENOM:
		case HALBERD:
		case SPETUM:		tmp += rnd(6); break;

		case BATTLE_AXE:
		case BARDICHE:
		case TRIDENT:		tmp += dice(2,4); break;

		case TSURUGI:
		case DWARVISH_MATTOCK:
		case TWO_HANDED_SWORD:	tmp += dice(2,6); break;
	    }
	} else {
	    if (objects[otyp].oc_wsdam)
		tmp = rnd(objects[otyp].oc_wsdam);
	    switch (otyp) {
		case IRON_CHAIN:
		case CROSSBOW_BOLT:
		case MACE:
		case WAR_HAMMER:
		case FLAIL:
		case SPETUM:
		case TRIDENT:		tmp++; break;

		case BATTLE_AXE:
		case BARDICHE:
		case BILL_GUISARME:
		case GUISARME:
		case LUCERN_HAMMER:
		case MORNING_STAR:
		case RANSEUR:
		case BROADSWORD:
		case ELVEN_BROADSWORD:
		case RUNESWORD:
		case VOULGE:		tmp += rnd(4); break;

		case ACID_VENOM:	tmp += rnd(6); break;
	    }
	}

	if (Is_weapon) {
		tmp += otmp->spe;
	}
	if (thrown && olaunch && ammo_and_launcher(otmp, olaunch) &&
	    objects[olaunch->otyp].oc_skill == P_SLING) {
		/* sling enchantment affects firing damage */
		tmp += olaunch->spe;
	}
	/* negative enchantments mustn't produce negative damage */
	if (tmp < 0) tmp = 0;

	if (objects[otyp].oc_material <= LEATHER && thick_skinned(ptr))
		/* thick skinned/scaled creatures don't feel it */
		tmp = 0;
	if (ptr == &mons[PM_SHADE] && objects[otyp].oc_material != SILVER)
		tmp = 0;

	/* "very heavy iron ball"; weight increase is in increments of 160 */
	if (otyp == HEAVY_IRON_BALL && tmp > 0) {
	    int wt = (int)objects[HEAVY_IRON_BALL].oc_weight;

	    if ((int)otmp->owt > wt) {
		wt = ((int)otmp->owt - wt) / 160;
		tmp += rnd(4 * wt);
		if (tmp > 25) tmp = 25;	/* objects[].oc_wldam */
	    }
	}

	double_damage = (spec_dbon(otmp, olaunch, thrown, mdef, 25) >= 25);

	/* Damage multiplier to replace multishot for heavy shot projectiles. */
	if (thrown && is_heavyshot(otmp, olaunch)) {
	    int multi_heavy = rnd(multishot_max(magr, otmp));
	    boolean odd_adjusted_multi = FALSE;
	    int old_tmp = tmp;

	    /* Make this cumulative with double damage bonus rather than
	       stacking them, so double damage is effectively +1 multiplier. */
	    if (multi_heavy > 1 && double_damage) {
		odd_adjusted_multi = !!((multi_heavy + 1) & 1);
		multi_heavy = (multi_heavy + 1) / 2;
	    }

	    tmp *= multi_heavy;

	    /* if the multiplier got rounded for double damage adjustment,
	       add the extra half now */
	    if (odd_adjusted_multi && double_damage)
		tmp += (old_tmp + 1) / 2;
	}

/*	Put weapon vs. monster type damage bonuses in below:	*/
	if (Is_weapon || otmp->oclass == GEM_CLASS ||
		otmp->oclass == BALL_CLASS || otmp->oclass == CHAIN_CLASS) {
	    int bonus = 0;

	    if (otmp->blessed && (is_undead(ptr) || is_demon(ptr)))
		bonus += rnd(4);
	    if (is_axe(otmp) && is_wooden(ptr))
		bonus += rnd(4);
	    if (objects[otyp].oc_material == SILVER && hates_silver(ptr))
		bonus += rnd(20);

	    /* if the weapon is going to get a double damage bonus, adjust
	       this bonus so that effectively it's added after the doubling */
	    if (bonus > 1 && double_damage)
		bonus = (bonus + 1) / 2;

	    tmp += bonus;
	}

	if (tmp > 0) {
		/* It's debateable whether a rusted blunt instrument
		   should do less damage than a pristine one, since
		   it will hit with essentially the same impact, but
		   there ought to some penalty for using damaged gear
		   so always subtract erosion even for blunt weapons. */
		tmp -= greatest_erosion(otmp);
		if (tmp < 1) tmp = 1;
	}

	return tmp;
}